

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_armor.cpp
# Opt level: O2

AInventory * __thiscall AHexenArmor::CreateCopy(AHexenArmor *this,AActor *other)

{
  AHexenArmor *this_00;
  
  this_00 = Spawn<AHexenArmor>();
  AddArmorToSlot(this_00,other,(this->super_AArmor).super_AInventory.super_AActor.health,
                 (this->super_AArmor).super_AInventory.Amount);
  (*(this->super_AArmor).super_AInventory.super_AActor.super_DThinker.super_DObject._vptr_DObject
    [0x36])(this);
  return (AInventory *)this_00;
}

Assistant:

AInventory *AHexenArmor::CreateCopy (AActor *other)
{
	// Like BasicArmor, HexenArmor is used in the inventory but not the map.
	// health is the slot this armor occupies.
	// Amount is the quantity to give (0 = normal max).
	AHexenArmor *copy = Spawn<AHexenArmor> ();
	copy->AddArmorToSlot (other, health, Amount);
	GoAwayAndDie ();
	return copy;
}